

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# readline.c
# Opt level: O0

uchar rl_bind_wrapper(EditLine *el,uchar c)

{
  uchar c_local;
  EditLine *el_local;
  
  if (map[c] == (rl_command_func_t *)0x0) {
    el_local._7_1_ = '\x06';
  }
  else {
    _rl_update_pos();
    (*map[c])(L'\x01',(wchar_t)c);
    if (rl_done == L'\0') {
      el_local._7_1_ = '\0';
    }
    else {
      el_local._7_1_ = '\x02';
    }
  }
  return el_local._7_1_;
}

Assistant:

static unsigned char
rl_bind_wrapper(EditLine *el __attribute__((__unused__)), unsigned char c)
{
	if (map[c] == NULL)
		return CC_ERROR;

	_rl_update_pos();

	(*map[c])(1, c);

	/* If rl_done was set by the above call, deal with it here */
	if (rl_done)
		return CC_EOF;

	return CC_NORM;
}